

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

void __thiscall YAML::Stream::Stream(Stream *this,istream *input)

{
  int_type ch;
  UtfIntroCharType UVar1;
  CharacterSet CVar2;
  uchar *puVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int *piVar9;
  int_type intro [4];
  undefined8 local_50;
  int_type local_48 [6];
  
  this->m_input = input;
  local_50 = &this->m_readahead;
  (this->m_mark).pos = 0;
  (this->m_mark).line = 0;
  *(undefined8 *)&(this->m_mark).column = 0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<char,_std::allocator<char>_>::_Deque_base
            (&local_50->super__Deque_base<char,_std::allocator<char>_>);
  puVar3 = (uchar *)operator_new__(0x800);
  this->m_pPrefetched = puVar3;
  this->m_nPrefetchedAvailable = 0;
  this->m_nPrefetchedUsed = 0;
  if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 5) == 0) {
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    uVar7 = 0;
    iVar8 = 0;
    while ((&s_introFinalState)[uVar7] == '\0') {
      ch = std::istream::get();
      lVar4 = (long)iVar8;
      iVar8 = iVar8 + 1;
      local_48[lVar4] = ch;
      UVar1 = IntroCharTypeOf(ch);
      lVar4 = uVar7 * 8;
      uVar7 = (ulong)*(uint *)(s_introTransitions + (ulong)UVar1 * 4 + uVar7 * 0x20);
      iVar5 = (int)(char)s_introUngetCount[(ulong)UVar1 + lVar4];
      if ('\0' < (char)s_introUngetCount[(ulong)UVar1 + lVar4]) {
        std::ios::clear((int)*(undefined8 *)(*(long *)input + -0x18) + (int)input);
        piVar9 = (int *)((long)&local_50 + (long)iVar8 * 4 + 4);
        for (; 0 < iVar5; iVar5 = iVar5 + -1) {
          if (*piVar9 != -1) {
            std::istream::putback((char)input);
          }
          iVar8 = iVar8 + -1;
          piVar9 = piVar9 + -1;
        }
      }
    }
    uVar6 = (int)uVar7 - 4;
    CVar2 = utf8;
    if (uVar6 < 8) {
      CVar2 = *(CharacterSet *)(&DAT_006ebc30 + (ulong)uVar6 * 4);
    }
    this->m_charSet = CVar2;
    ReadAheadTo(this,0);
  }
  return;
}

Assistant:

Stream::Stream(std::istream& input)
    : m_input(input),
      m_mark{},
      m_charSet{},
      m_readahead{},
      m_pPrefetched(new unsigned char[YAML_PREFETCH_SIZE]),
      m_nPrefetchedAvailable(0),
      m_nPrefetchedUsed(0) {
  using char_traits = std::istream::traits_type;

  if (!input)
    return;

  // Determine (or guess) the character-set by reading the BOM, if any.  See
  // the YAML specification for the determination algorithm.
  char_traits::int_type intro[4]{};
  int nIntroUsed = 0;
  UtfIntroState state = uis_start;
  for (; !s_introFinalState[state];) {
    std::istream::int_type ch = input.get();
    intro[nIntroUsed++] = ch;
    UtfIntroCharType charType = IntroCharTypeOf(ch);
    UtfIntroState newState = s_introTransitions[state][charType];
    int nUngets = s_introUngetCount[state][charType];
    if (nUngets > 0) {
      input.clear();
      for (; nUngets > 0; --nUngets) {
        if (char_traits::eof() != intro[--nIntroUsed])
          input.putback(char_traits::to_char_type(intro[nIntroUsed]));
      }
    }
    state = newState;
  }

  switch (state) {
    case uis_utf8:
      m_charSet = utf8;
      break;
    case uis_utf16le:
      m_charSet = utf16le;
      break;
    case uis_utf16be:
      m_charSet = utf16be;
      break;
    case uis_utf32le:
      m_charSet = utf32le;
      break;
    case uis_utf32be:
      m_charSet = utf32be;
      break;
    default:
      m_charSet = utf8;
      break;
  }

  ReadAheadTo(0);
}